

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O1

void __thiscall hdc::Program::Program(Program *this)

{
  _Rb_tree_header *p_Var1;
  
  ASTNode::ASTNode(&this->super_ASTNode);
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR_accept_00196dd0;
  p_Var1 = &(this->sourceFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->sourceFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->sourceFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->sourceFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->sourceFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->sourceFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->functionCounter = 0;
  this->classCounter = 0;
  ASTNode::setKind(&this->super_ASTNode,AST_PROGRAM);
  return;
}

Assistant:

Program::Program() {
    functionCounter = 0;
    classCounter = 0;
    setKind(AST_PROGRAM);
}